

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

uint64_t __thiscall Path::lastModifiedMs(Path *this)

{
  uint64_t uVar1;
  bool ok;
  stat st;
  undefined1 local_99 [89];
  long local_40;
  ulong local_38;
  
  stat((Path *)(local_99 + 1),(char *)this,(stat *)local_99);
  if (local_99[0] == '\x01') {
    uVar1 = local_38 / 1000000 + local_40 * 1000;
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint64_t Path::lastModifiedMs() const
{
    bool ok;
    struct stat st = stat(&ok);
    if (!ok)
        return 0;

#ifdef HAVE_STATMTIM
    return st.st_mtim.tv_sec * static_cast<uint64_t>(1000) + st.st_mtim.tv_nsec / static_cast<uint64_t>(1000000);
#else
    return st.st_mtime * static_cast<uint64_t>(1000);
#endif
}